

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

absl * __thiscall absl::StrCat_abi_cxx11_(absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  reference pcVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  char *pcVar5;
  long lVar6;
  char *out;
  reference local_48;
  char *begin;
  undefined1 local_29;
  AlphaNum *local_28;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_29 = 0;
  local_28 = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)this;
  std::__cxx11::string::string((string *)this);
  sVar2 = AlphaNum::size(b_local);
  sVar3 = AlphaNum::size(c_local);
  sVar4 = AlphaNum::size(local_28);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             sVar2 + sVar3 + sVar4);
  out = (char *)std::__cxx11::string::begin();
  local_48 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar5 = Append(local_48,b_local);
  pcVar5 = Append(pcVar5,c_local);
  pcVar5 = Append(pcVar5,local_28);
  pcVar1 = local_48;
  lVar6 = std::__cxx11::string::size();
  if (pcVar5 != pcVar1 + lVar6) {
    __assert_fail("out == begin + result.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0x75,"string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &)")
    ;
  }
  return this;
}

Assistant:

string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c) {
  string result;
  strings_internal::STLStringResizeUninitialized(
      &result, a.size() + b.size() + c.size());
  char* const begin = &*result.begin();
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + result.size());
  return result;
}